

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCMapping.c
# Opt level: O3

_Bool PPC_alias_insn(char *name,ppc_alias *alias)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  
  lVar4 = 8;
  do {
    iVar1 = strcmp(name,*(char **)((long)&alias_insn_name_maps[0].id + lVar4));
    if (iVar1 == 0) {
      uVar3 = *(uint *)((long)&group_name_maps[0xb].name + lVar4);
      iVar1 = *(int *)((long)&group_name_maps[0xb].name + lVar4 + 4);
      goto LAB_0019d9e7;
    }
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x508);
  iVar2 = name2id(insn_name_maps + 1,0x3a5,name);
  iVar1 = 0;
  if (iVar2 != -1) {
    uVar3 = insn_name_maps[iVar2].id;
LAB_0019d9e7:
    alias->id = uVar3;
    alias->cc = iVar1;
    iVar1 = 1;
  }
  return SUB41(iVar1,0);
}

Assistant:

bool PPC_alias_insn(const char *name, struct ppc_alias *alias)
{
	size_t i;
#ifndef CAPSTONE_DIET
	int x;
#endif

	for(i = 0; i < ARR_SIZE(alias_insn_name_maps); i++) {
		if (!strcmp(name, alias_insn_name_maps[i].mnem)) {
			alias->id = alias_insn_name_maps[i].id;
			alias->cc = alias_insn_name_maps[i].cc;
			return true;
		}
	}

#ifndef CAPSTONE_DIET
	// not really an alias insn
	x = name2id(&insn_name_maps[1], ARR_SIZE(insn_name_maps) - 1, name);
	if (x != -1) {
		alias->id = insn_name_maps[x].id;
		alias->cc = PPC_BC_INVALID;
		return true;
	}
#endif

	// not found
	return false;
}